

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::average_down_edges(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  DistributionMapping *this;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *pFVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  bool bVar7;
  uint uVar8;
  Periodicity *period;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  Real facInv;
  double dVar15;
  int local_32c;
  ulong local_318;
  long local_308;
  undefined8 local_2b8;
  int local_2b0;
  uint local_2ac;
  uint local_2a8;
  int local_2a4;
  FabArray<amrex::FArrayBox> *local_298;
  FabArray<amrex::FArrayBox> *local_290;
  ulong local_288;
  long local_280;
  long local_278;
  ulong local_270;
  double *local_268;
  double *local_260;
  undefined1 local_258 [24];
  pointer pbStack_240;
  undefined8 local_238;
  int local_230;
  BoxArray local_218;
  MFIter mfi;
  
  uVar8 = 0;
  switch((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    uVar8 = *(uint *)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                      m_op;
    break;
  default:
    uVar8 = *(uint *)((long)&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.
                             m_bat.m_op + 4);
  }
  uVar12 = 0;
  do {
    if ((uVar8 >> (uVar12 & 0x1f) & 1) == 0) goto LAB_004b1399;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 3);
  uVar12 = 3;
LAB_004b1399:
  if ((2 < uVar12) || ((uVar8 | 1 << (uVar12 & 0x1f)) != 7)) {
    Abort_host("average_down_edges: not face index type");
  }
  uVar8 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  this = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  bVar7 = DistributionMapping::operator==
                    (this,&(crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                           distributionMap);
  if ((bVar7) &&
     ((fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
    pFVar5 = &fine->super_FabArray<amrex::FArrayBox>;
    pFVar6 = &crse->super_FabArray<amrex::FArrayBox>;
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        local_290 = pFVar6;
        local_298 = pFVar5;
        pFVar6 = local_290;
        pFVar5 = local_298;
        MFIter::growntilebox((Box *)&local_2b8,&mfi,ngcrse);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_218,pFVar6,&mfi);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_258,pFVar5,&mfi);
        if (0 < (int)uVar8) {
          local_270 = (ulong)local_2ac;
          local_288 = (ulong)local_2a8;
          local_318 = 0;
          do {
            iVar4 = local_2b0;
            if (local_2b0 <= local_2a4) {
              do {
                if (local_2b8._4_4_ <= (int)local_2a8) {
                  uVar1 = ratio->vect[0];
                  uVar2 = ratio->vect[1];
                  uVar3 = ratio->vect[2];
                  local_278 = (long)(int)uVar2;
                  local_32c = uVar2 * local_2b8._4_4_;
                  local_280 = (long)(int)(uVar3 * iVar4);
                  local_308 = (long)local_2b8._4_4_;
                  do {
                    if ((int)local_2b8 <= (int)local_2ac) {
                      local_260 = (double *)
                                  (local_258._0_8_ +
                                  ((local_308 * local_278 - (long)local_238._4_4_) * local_258._8_8_
                                  + (long)pbStack_240 * local_318) * 8);
                      lVar10 = (local_280 - local_230) * local_258._16_8_;
                      local_268 = (double *)
                                  (local_258._0_8_ + (lVar10 + (long)pbStack_240 * local_318) * 8);
                      iVar13 = uVar1 * (int)local_2b8 - (int)local_238;
                      lVar14 = (long)(int)local_2b8;
                      do {
                        if (uVar12 == 2) {
                          if ((int)uVar3 < 1) {
                            dVar15 = 0.0;
                          }
                          else {
                            dVar15 = 0.0;
                            uVar11 = (ulong)uVar3;
                            iVar9 = uVar3 * iVar4 - local_230;
                            do {
                              dVar15 = dVar15 + local_260[(lVar14 * (int)uVar1 -
                                                          (long)(int)local_238) +
                                                          local_258._16_8_ * (long)iVar9];
                              iVar9 = iVar9 + 1;
                              uVar11 = uVar11 - 1;
                            } while (uVar11 != 0);
                          }
                          dVar15 = dVar15 * (1.0 / (double)(int)uVar3);
LAB_004b176e:
                          *(double *)
                           ((local_308 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                            CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                     local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 8 +
                            CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                     local_218.m_bat.m_bat_type) +
                            ((long)iVar4 - (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                            local_218.m_bat.m_op._12_8_ * 8 +
                            local_218.m_bat.m_op._20_8_ * local_318 * 8 +
                           (lVar14 - local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) * 8) = dVar15
                          ;
                        }
                        else {
                          if (uVar12 == 1) {
                            if ((int)uVar2 < 1) {
                              dVar15 = 0.0;
                            }
                            else {
                              dVar15 = 0.0;
                              uVar11 = (ulong)uVar2;
                              iVar9 = local_32c - local_238._4_4_;
                              do {
                                dVar15 = dVar15 + local_268[(lVar14 * (int)uVar1 -
                                                            (long)(int)local_238) +
                                                            local_258._8_8_ * (long)iVar9];
                                iVar9 = iVar9 + 1;
                                uVar11 = uVar11 - 1;
                              } while (uVar11 != 0);
                            }
                            dVar15 = dVar15 * (1.0 / (double)(int)uVar2);
                            goto LAB_004b176e;
                          }
                          if (uVar12 == 0) {
                            dVar15 = 0.0;
                            uVar11 = (ulong)uVar1;
                            iVar9 = iVar13;
                            if (0 < (int)uVar1) {
                              do {
                                dVar15 = dVar15 + local_260[lVar10 + iVar9];
                                uVar11 = uVar11 - 1;
                                iVar9 = iVar9 + 1;
                              } while (uVar11 != 0);
                            }
                            dVar15 = dVar15 * (1.0 / (double)(int)uVar1);
                            goto LAB_004b176e;
                          }
                        }
                        lVar14 = lVar14 + 1;
                        iVar13 = iVar13 + uVar1;
                      } while (local_2ac + 1 != (int)lVar14);
                    }
                    local_308 = local_308 + 1;
                    local_32c = local_32c + uVar2;
                  } while (local_2a8 + 1 != (int)local_308);
                }
                bVar7 = iVar4 != local_2a4;
                iVar4 = iVar4 + 1;
              } while (bVar7);
            }
            local_318 = local_318 + 1;
          } while (local_318 != uVar8);
        }
        MFIter::operator++(&mfi);
        pFVar5 = local_298;
        pFVar6 = local_290;
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
    local_258._0_8_ = (double *)0x1;
    local_258._8_8_ = (Arena *)0x0;
    local_258._16_8_ = (pointer)0x0;
    pbStack_240 = (pointer)0x0;
    local_238 = (pointer)0x0;
    local_2b8 = &PTR__FabFactory_0074e8d0;
    MultiFab::MultiFab((MultiFab *)&mfi,&local_218,this,uVar8,ngcrse,(MFInfo *)local_258,
                       (FabFactory<amrex::FArrayBox> *)&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_258 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_edges(fine,(MultiFab *)&mfi,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    local_258._4_4_ = ngcrse;
    local_258._0_4_ = ngcrse;
    local_258._8_4_ = ngcrse;
    local_218.m_bat.m_bat_type = ngcrse;
    local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
    local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,uVar8,
               (IntVect *)&local_218,(IntVect *)local_258,period,COPY,(CPC *)0x0,false);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  return;
}

Assistant:

void average_down_edges (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.cellCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.set(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.nodeCentered()) {
            amrex::Abort("average_down_edges: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_edges(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_edges(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_edges(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }